

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O2

void __thiscall
agge::renderer::
adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_short,_unsigned_char>_>
::operator()(adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_short,_unsigned_char>_>
             *this,int x,int length,cover_type *covers)

{
  int iVar1;
  int x_00;
  uint length_00;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = (this->_window).x1;
  x_00 = x;
  if (iVar1 - x != 0 && x <= iVar1) {
    x_00 = iVar1;
  }
  iVar2 = -(iVar1 - x);
  iVar4 = 0;
  if (x < iVar1) {
    iVar4 = iVar2;
  }
  length_00 = (this->_window).x2 - x_00;
  if (iVar4 + length < (int)length_00) {
    length_00 = iVar4 + length;
  }
  if (0 < (int)length_00) {
    lVar3 = 0;
    if (x < iVar1) {
      lVar3 = -(long)iVar2;
    }
    tests::mocks::blender<unsigned_short,_unsigned_char>::operator()
              (this->_blender,this->_row + x_00,x_00,this->_y,length_00,covers + lVar3);
    return;
  }
  return;
}

Assistant:

inline void renderer::adapter<BitmapT, BlenderT>::operator ()(int x, int length, const cover_type *covers)
	{
		if (x < _window.x1)
		{
			const int dx = x - _window.x1;

			x = _window.x1;
			length += dx;
			covers -= dx;
		}
		update_min(length, _window.x2 - x);
		if (length > 0)
			_blender(_row + x, x, _y, length, covers);
	}